

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int nn_pipe_recv(nn_pipe *self,nn_msg *msg)

{
  FILE *__stream;
  char *pcVar1;
  undefined8 in_RSI;
  long in_RDI;
  nn_pipebase *pipebase;
  int rc;
  int in_stack_ffffffffffffffcc;
  uint local_4;
  
  if (*(char *)(in_RDI + 0x61) != '\x01') {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipebase->instate == NN_PIPEBASE_INSTATE_IDLE"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/pipe.c"
            ,0xca);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined1 *)(in_RDI + 0x61) = 2;
  local_4 = (**(code **)(*(long *)(in_RDI + 0x58) + 8))(in_RDI,in_RSI);
  if ((int)local_4 < 0) {
    nn_backtrace_print();
    __stream = _stderr;
    pcVar1 = nn_err_strerror(in_stack_ffffffffffffffcc);
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar1,(ulong)-local_4,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/pipe.c"
            ,0xcd);
    fflush(_stderr);
    nn_err_abort();
  }
  if (*(char *)(in_RDI + 0x61) == '\x03') {
    *(undefined1 *)(in_RDI + 0x61) = 1;
  }
  else {
    if (*(char *)(in_RDI + 0x61) != '\x02') {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "pipebase->instate == NN_PIPEBASE_INSTATE_RECEIVING",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/pipe.c"
              ,0xd3);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined1 *)(in_RDI + 0x61) = 4;
    local_4 = local_4 | 1;
  }
  return local_4;
}

Assistant:

int nn_pipe_recv (struct nn_pipe *self, struct nn_msg *msg)
{
    int rc;
    struct nn_pipebase *pipebase;

    pipebase = (struct nn_pipebase*) self;
    nn_assert (pipebase->instate == NN_PIPEBASE_INSTATE_IDLE);
    pipebase->instate = NN_PIPEBASE_INSTATE_RECEIVING;
    rc = pipebase->vfptr->recv (pipebase, msg);
    errnum_assert (rc >= 0, -rc);

    if (nn_fast (pipebase->instate == NN_PIPEBASE_INSTATE_RECEIVED)) {
        pipebase->instate = NN_PIPEBASE_INSTATE_IDLE;
        return rc;
    }
    nn_assert (pipebase->instate == NN_PIPEBASE_INSTATE_RECEIVING);
    pipebase->instate = NN_PIPEBASE_INSTATE_ASYNC;
    return rc | NN_PIPEBASE_RELEASE;
}